

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O1

bool __thiscall Am_Value::operator==(Am_Value *this,Am_Value *test_value)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  
  uVar1 = this->type;
  switch(uVar1 >> 0xc & 7) {
  case 0:
    switch(uVar1) {
    case 0:
      bVar2 = test_value->type == 0;
      break;
    case 1:
      bVar2 = test_value->type == 1;
      break;
    case 2:
    case 3:
      bVar2 = operator==(test_value,(this->value).long_value);
      return bVar2;
    case 4:
      bVar2 = operator==(test_value,(this->value).bool_value);
      return bVar2;
    case 5:
      bVar2 = operator==(test_value,(this->value).float_value);
      return bVar2;
    case 6:
    case 8:
      return false;
    case 7:
      bVar2 = test_value->type == 7;
      bVar3 = (test_value->value).bool_value == (this->value).bool_value;
      goto LAB_00227cfa;
    case 9:
      bVar2 = (test_value->value).wrapper_value == (this->value).wrapper_value;
      break;
    case 10:
      bVar2 = operator==(test_value,(this->value).proc_value);
      return bVar2;
    default:
      if ((uVar1 != 0x8008) && (uVar1 != 0x8006)) {
        return false;
      }
      goto switchD_00227cc2_caseD_2;
    }
    break;
  case 1:
    bVar2 = test_value->type == uVar1;
    break;
  case 2:
switchD_00227cc2_caseD_2:
    bVar2 = operator==(test_value,(this->value).wrapper_value);
    return bVar2;
  case 3:
    uVar1 = test_value->type;
    if ((uVar1 & 0x7000) == 0x3000) {
      bVar2 = (test_value->value).wrapper_value == (this->value).wrapper_value;
    }
    else {
      if (10 < uVar1) {
        return false;
      }
      if ((0x60cU >> (uVar1 & 0x1f) & 1) == 0) {
        return false;
      }
      bVar2 = (this->value).wrapper_value == (Am_Wrapper *)0x0 &&
              (test_value->value).wrapper_value == (Am_Wrapper *)0x0;
    }
    break;
  case 4:
    bVar2 = uVar1 == test_value->type;
    bVar3 = (test_value->value).wrapper_value == (this->value).wrapper_value;
LAB_00227cfa:
    return (bool)(bVar3 & bVar2);
  default:
    return false;
  }
  return bVar2;
}

Assistant:

bool
Am_Value::operator==(const Am_Value &test_value) const
{
  switch (Am_Type_Class(type)) {
  case Am_SIMPLE_TYPE:
    switch (type) {
    case Am_STRING:
    case Am_DOUBLE:
      return test_value == value.wrapper_value;
    case Am_VOIDPTR:
      return test_value == value.voidptr_value;
    case Am_INT:
    case Am_LONG:
      return test_value == value.long_value;
    case Am_BOOL:
      return test_value == value.bool_value;
    case Am_FLOAT:
      return test_value == value.float_value;
    case Am_CHAR:
      return test_value == value.char_value;
    case Am_PROC:
      return test_value == value.proc_value;
    case Am_NONE:
      return test_value.type == Am_NONE;
    case Am_ZERO:
      return test_value.type == Am_ZERO;
    default:
      return false;
    }
  case Am_WRAPPER:
    return test_value == value.wrapper_value;
  case Am_METHOD:
    return test_value == value.method_value;
  case Am_ENUM:
    return type == test_value.type &&
           test_value.value.long_value == value.long_value;
  case Am_ERROR_VALUE_TYPE:
    return test_value.type == type;
  }
  return false; // should never get here, but need to return something
}